

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ElabSystemTaskSyntax::setChild
          (ElabSystemTaskSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00528dfc + *(int *)(&DAT_00528dfc + index * 4)))();
  return;
}

Assistant:

void ElabSystemTaskSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: name = child.token(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}